

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O1

int rtr_undo_update_pfx_table(rtr_socket *rtr_socket,pfx_table *pfx_table,void *pdu)

{
  int iVar1;
  long in_FS_OFFSET;
  pfx_record pfxr;
  pfx_record local_40;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (((int)*(char *)((long)pdu + 1) & ~RESET_QUERY) != IPV4_PREFIX) {
    __assert_fail("type == IPV4_PREFIX || type == IPV6_PREFIX",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/rtr/packets.c"
                  ,0x2df,
                  "int rtr_undo_update_pfx_table(struct rtr_socket *, struct pfx_table *, void *)");
  }
  rtr_prefix_pdu_2_pfx_record(rtr_socket,pdu,&local_40,(int)*(char *)((long)pdu + 1));
  if (*(char *)((long)pdu + 8) == '\0') {
    iVar1 = pfx_table_add(pfx_table,&local_40);
  }
  else {
    iVar1 = -1;
    if (*(char *)((long)pdu + 8) == '\x01') {
      iVar1 = pfx_table_remove(pfx_table,&local_40);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

static int rtr_undo_update_pfx_table(struct rtr_socket *rtr_socket, struct pfx_table *pfx_table, void *pdu)
{
	const enum pdu_type type = rtr_get_pdu_type(pdu);

	assert(type == IPV4_PREFIX || type == IPV6_PREFIX);

	struct pfx_record pfxr;

	rtr_prefix_pdu_2_pfx_record(rtr_socket, pdu, &pfxr, type);

	int rtval = RTR_ERROR;
	// invert add/remove operation
	if (((struct pdu_ipv4 *)pdu)->flags == 1)
		rtval = pfx_table_remove(pfx_table, &pfxr);
	else if (((struct pdu_ipv4 *)pdu)->flags == 0)
		rtval = pfx_table_add(pfx_table, &pfxr);
	return rtval;
}